

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  byte *pbVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  
  sVar5 = 0;
  sVar6 = sVar5;
  if (buflen != 0) {
    do {
      sVar6 = sVar5;
      if (buf[sVar5] != '\0') break;
      sVar5 = sVar5 + 1;
      sVar6 = buflen;
    } while (buflen != sVar5);
  }
  uVar9 = buflen - sVar6;
  iVar3 = mbedtls_mpi_grow(X,((uVar9 >> 3) + 1) - (ulong)((uVar9 & 7) == 0));
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(X,1), iVar3 == 0)) {
    iVar3 = 0;
    memset(X->p,0,X->n << 3);
    pmVar2 = X->p;
    *pmVar2 = 0;
    X->s = 1;
    if (sVar6 < buflen) {
      pbVar4 = buf + buflen;
      iVar3 = 0;
      bVar7 = 0;
      uVar8 = 0;
      do {
        pbVar4 = pbVar4 + -1;
        puVar1 = (ulong *)((long)pmVar2 + (uVar8 & 0xfffffffffffffff8));
        *puVar1 = *puVar1 | (ulong)*pbVar4 << (bVar7 & 0x38);
        uVar8 = uVar8 + 1;
        bVar7 = bVar7 + 8;
      } while (uVar9 != uVar8);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t i, j, n;

    for( n = 0; n < buflen; n++ )
        if( buf[n] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, CHARS_TO_LIMBS( buflen - n ) ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = buflen, j = 0; i > n; i--, j++ )
        X->p[j / ciL] |= ((mbedtls_mpi_uint) buf[i - 1]) << ((j % ciL) << 3);

cleanup:

    return( ret );
}